

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

void stbtt__csctx_rmove_to(stbtt__csctx *ctx,float dx,float dy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined4 in_XMM0_Db;
  float fVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  
  stbtt__csctx_close_shape(ctx);
  auVar3._4_4_ = in_XMM0_Db;
  auVar3._0_4_ = dx;
  auVar3._8_4_ = in_XMM0_Dc;
  auVar3._12_4_ = in_XMM0_Dd;
  uVar1 = ctx->x;
  uVar2 = ctx->y;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)dy),0x10);
  fVar4 = (float)uVar1 + auVar3._0_4_;
  fVar5 = (float)uVar2 + auVar3._4_4_;
  auVar3 = vmovshdup_avx(CONCAT412(auVar3._12_4_ + 0.0,
                                   CONCAT48(auVar3._8_4_ + 0.0,CONCAT44(fVar5,fVar4))));
  ctx->first_x = fVar4;
  ctx->first_y = fVar5;
  ctx->x = fVar4;
  ctx->y = fVar5;
  stbtt__csctx_v(ctx,'\x01',(int)fVar4,(int)auVar3._0_4_,0,0,0,0);
  return;
}

Assistant:

static void stbtt__csctx_rmove_to(stbtt__csctx *ctx, float dx, float dy)
{
   stbtt__csctx_close_shape(ctx);
   ctx->first_x = ctx->x = ctx->x + dx;
   ctx->first_y = ctx->y = ctx->y + dy;
   stbtt__csctx_v(ctx, STBTT_vmove, (int)ctx->x, (int)ctx->y, 0, 0, 0, 0);
}